

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_collection.cpp
# Opt level: O1

void duckdb::ColumnDataCopy<duckdb::list_entry_t>
               (ColumnDataMetaData *meta_data,UnifiedVectorFormat *source_data,Vector *source,
               idx_t offset,idx_t copy_count)

{
  ushort uVar1;
  ColumnDataCollectionSegment *pCVar2;
  ColumnDataAppendState *state;
  sel_t *psVar3;
  unsigned_long *puVar4;
  undefined8 uVar5;
  data_ptr_t pdVar6;
  byte bVar7;
  element_type *peVar8;
  list_entry_t *source_data_1;
  Vector *this;
  reference pvVar9;
  VectorDataIndex VVar10;
  VectorChildIndex VVar11;
  reference pvVar12;
  reference pvVar13;
  ColumnDataAllocator *pCVar14;
  data_ptr_t pdVar15;
  TemplatedValidityData<unsigned_long> *pTVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  idx_t iVar20;
  ulong uVar21;
  idx_t __n;
  idx_t iVar22;
  long lVar23;
  long lVar24;
  ColumnDataCollectionSegment *segment;
  ColumnDataAppendState *append_state;
  SelectionVector sel;
  ConsecutiveChildListInfo info;
  Vector sliced_child_vector;
  UnifiedVectorFormat child_vector_data;
  idx_t local_198;
  SelectionVector local_158;
  ConsecutiveChildListInfo local_138;
  long local_120;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_118;
  _Head_base<0UL,_unsigned_long_*,_false> local_110;
  LogicalType local_108 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  ColumnDataMetaData local_a8;
  UnifiedVectorFormat local_78;
  
  pCVar2 = meta_data->segment;
  this = ListVector::GetEntry(source);
  pvVar9 = vector<duckdb::VectorMetaData,_true>::operator[]
                     (&meta_data->segment->vector_data,(meta_data->vector_data_index).index);
  if ((pvVar9->child_index).index == 0xffffffffffffffff) {
    VVar10 = ColumnDataCollectionSegment::AllocateVector
                       (pCVar2,&this->type,meta_data->chunk_data,
                        &meta_data->state->current_chunk_state,(VectorDataIndex)0xffffffffffffffff);
    VVar11 = ColumnDataCollectionSegment::AddChildIndex(meta_data->segment,VVar10);
    pvVar9 = vector<duckdb::VectorMetaData,_true>::operator[]
                       (&meta_data->segment->vector_data,(meta_data->vector_data_index).index);
    (pvVar9->child_index).index = VVar11.index;
  }
  iVar20 = 0;
  pvVar12 = vector<duckdb::ColumnDataCopyFunction,_true>::operator[]
                      (&meta_data->copy_function->child_functions,0);
  pvVar9 = vector<duckdb::VectorMetaData,_true>::operator[]
                     (&meta_data->segment->vector_data,(meta_data->vector_data_index).index);
  pvVar13 = vector<duckdb::VectorDataIndex,_true>::operator[]
                      (&pCVar2->child_indices,(pvVar9->child_index).index);
  iVar22 = pvVar13->index;
  if (iVar22 != 0xffffffffffffffff) {
    iVar20 = 0;
    __n = iVar22;
    do {
      pvVar9 = vector<duckdb::VectorMetaData,_true>::operator[](&pCVar2->vector_data,__n);
      iVar20 = iVar20 + pvVar9->count;
      __n = (pvVar9->next_data).index;
    } while (__n != 0xffffffffffffffff);
  }
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  local_a8.segment = meta_data->segment;
  local_a8.state = meta_data->state;
  local_a8.chunk_data = meta_data->chunk_data;
  local_a8.child_list_size = 0xffffffffffffffff;
  local_a8.copy_function = pvVar12;
  local_a8.vector_data_index.index = iVar22;
  ListVector::GetConsecutiveChildListInfo(&local_138,source,offset,copy_count);
  if (local_138.needs_slicing == true) {
    SelectionVector::SelectionVector(&local_158,local_138.child_list_info.length);
    ListVector::GetConsecutiveChildSelVector(source,&local_158,offset,copy_count);
    Vector::Vector((Vector *)&local_110,this,&local_158,local_138.child_list_info.length);
    Vector::Flatten((Vector *)&local_110,local_138.child_list_info.length);
    local_138.child_list_info.offset = 0;
    Vector::ToUnifiedFormat((Vector *)&local_110,local_138.child_list_info.length,&local_78);
    (*pvVar12->function)
              (&local_a8,&local_78,(Vector *)&local_110,local_138.child_list_info.offset,
               local_138.child_list_info.length);
    if (local_b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0._M_pi);
    }
    if (local_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0._M_pi);
    }
    if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
    }
    LogicalType::~LogicalType(local_108);
    if (local_158.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_158.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  else {
    Vector::ToUnifiedFormat(this,local_138.child_list_info.length,&local_78);
    (*pvVar12->function)
              (&local_a8,&local_78,this,local_138.child_list_info.offset,
               local_138.child_list_info.length);
  }
  meta_data->child_list_size = iVar20;
  pCVar2 = meta_data->segment;
  state = meta_data->state;
  local_198 = offset;
  if (local_138.is_constant == true) {
    if (copy_count != 0) {
      VVar10.index = (meta_data->vector_data_index).index;
      do {
        pvVar9 = vector<duckdb::VectorMetaData,_true>::operator[](&pCVar2->vector_data,VVar10.index)
        ;
        uVar21 = (ulong)(0x800 - pvVar9->count);
        uVar17 = copy_count;
        if (uVar21 < copy_count) {
          uVar17 = uVar21;
        }
        pCVar14 = shared_ptr<duckdb::ColumnDataAllocator,_true>::operator->(&pCVar2->allocator);
        pdVar15 = ColumnDataAllocator::GetDataPointer
                            (pCVar14,&state->current_chunk_state,pvVar9->block_id,pvVar9->offset);
        local_110._M_head_impl = (unsigned_long *)(pdVar15 + 0x8000);
        local_108[0]._0_8_ = (element_type *)0x0;
        local_108[0].type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_108[0].type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        if (pvVar9->count == 0) {
          switchD_01306cb1::default(local_110._M_head_impl,0xff,0x100);
        }
        if ((source_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (uVar21 != 0) {
            pdVar6 = source_data->data;
            psVar3 = source_data->sel->sel_vector;
            uVar1 = pvVar9->count;
            lVar23 = 0;
            iVar22 = local_198;
            do {
              iVar20 = iVar22;
              if (psVar3 != (sel_t *)0x0) {
                iVar20 = (idx_t)psVar3[iVar22];
              }
              uVar5 = *(undefined8 *)(pdVar6 + iVar20 * 0x10 + 8);
              *(idx_t *)(pdVar15 + lVar23 + (ulong)uVar1 * 0x10) = meta_data->child_list_size;
              *(undefined8 *)(pdVar15 + lVar23 + (ulong)uVar1 * 0x10 + 8) = uVar5;
              lVar23 = lVar23 + 0x10;
              iVar22 = iVar22 + 1;
            } while ((uVar17 + (uVar17 == 0)) * 0x10 != lVar23);
          }
        }
        else if (uVar21 != 0) {
          pdVar15 = pdVar15 + 8;
          lVar23 = local_198 * 4;
          lVar24 = 0;
          local_120 = lVar23;
          do {
            psVar3 = source_data->sel->sel_vector;
            if (psVar3 == (sel_t *)0x0) {
              uVar21 = local_198 + lVar24;
            }
            else {
              uVar21 = (ulong)*(uint *)((long)psVar3 + lVar24 * 4 + lVar23);
            }
            puVar4 = (source_data->validity).super_TemplatedValidityMask<unsigned_long>.
                     validity_mask;
            if ((puVar4 == (unsigned_long *)0x0) ||
               ((puVar4[uVar21 >> 6] >> (uVar21 & 0x3f) & 1) != 0)) {
              uVar5 = *(undefined8 *)(source_data->data + uVar21 * 0x10 + 8);
              lVar18 = (ulong)pvVar9->count * 0x10;
              *(idx_t *)(pdVar15 + lVar18 + -8) = meta_data->child_list_size;
              *(undefined8 *)(pdVar15 + lVar18) = uVar5;
            }
            else {
              uVar1 = pvVar9->count;
              if (local_110._M_head_impl == (unsigned_long *)0x0) {
                local_118 = local_108[0].type_info_.internal.
                            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&local_158,(unsigned_long *)&local_118);
                peVar8 = local_108[0].type_info_.internal.
                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr;
                local_108[0].type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)
                     local_158.selection_data.internal.
                     super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                local_108[0]._0_8_ = local_158.sel_vector;
                local_158.sel_vector = (sel_t *)0x0;
                local_158.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x0;
                if (peVar8 != (element_type *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar8);
                }
                if ((element_type *)
                    local_158.selection_data.internal.
                    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                    (element_type *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_158.selection_data.internal.
                             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
                }
                pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                      *)local_108);
                local_110._M_head_impl =
                     (pTVar16->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                lVar23 = local_120;
              }
              uVar21 = (ulong)uVar1 + lVar24;
              bVar7 = (byte)uVar21 & 0x3f;
              local_110._M_head_impl[uVar21 >> 6] =
                   local_110._M_head_impl[uVar21 >> 6] &
                   (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
            }
            lVar24 = lVar24 + 1;
            pdVar15 = pdVar15 + 0x10;
          } while (uVar17 + (uVar17 == 0) != lVar24);
        }
        pvVar9->count = pvVar9->count + (short)uVar17;
        copy_count = copy_count - uVar17;
        if (copy_count != 0) {
          if ((pvVar9->next_data).index == 0xffffffffffffffff) {
            ColumnDataCollectionSegment::AllocateVector
                      (pCVar2,&source->type,meta_data->chunk_data,&state->current_chunk_state,VVar10
                      );
          }
          pvVar9 = vector<duckdb::VectorMetaData,_true>::operator[]
                             (&pCVar2->vector_data,VVar10.index);
          VVar10.index = (pvVar9->next_data).index;
        }
        if (local_108[0].type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_108[0].type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
        local_198 = local_198 + uVar17;
      } while (copy_count != 0);
    }
  }
  else if (copy_count != 0) {
    VVar10.index = (meta_data->vector_data_index).index;
    do {
      pvVar9 = vector<duckdb::VectorMetaData,_true>::operator[](&pCVar2->vector_data,VVar10.index);
      uVar21 = (ulong)(0x800 - pvVar9->count);
      uVar17 = copy_count;
      if (uVar21 < copy_count) {
        uVar17 = uVar21;
      }
      pCVar14 = shared_ptr<duckdb::ColumnDataAllocator,_true>::operator->(&pCVar2->allocator);
      pdVar15 = ColumnDataAllocator::GetDataPointer
                          (pCVar14,&state->current_chunk_state,pvVar9->block_id,pvVar9->offset);
      local_110._M_head_impl = (unsigned_long *)(pdVar15 + 0x8000);
      local_108[0]._0_8_ = (element_type *)0x0;
      local_108[0].type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_108[0].type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      if (pvVar9->count == 0) {
        switchD_01306cb1::default(local_110._M_head_impl,0xff,0x100);
      }
      if ((source_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (uVar21 != 0) {
          pdVar6 = source_data->data;
          psVar3 = source_data->sel->sel_vector;
          uVar1 = pvVar9->count;
          lVar23 = 0;
          iVar22 = local_198;
          do {
            iVar20 = iVar22;
            if (psVar3 != (sel_t *)0x0) {
              iVar20 = (idx_t)psVar3[iVar22];
            }
            lVar24 = *(long *)(pdVar6 + iVar20 * 0x10 + 8);
            iVar20 = meta_data->child_list_size;
            meta_data->child_list_size = iVar20 + lVar24;
            *(idx_t *)(pdVar15 + lVar23 + (ulong)uVar1 * 0x10) = iVar20;
            *(long *)(pdVar15 + lVar23 + (ulong)uVar1 * 0x10 + 8) = lVar24;
            lVar23 = lVar23 + 0x10;
            iVar22 = iVar22 + 1;
          } while ((uVar17 + (uVar17 == 0)) * 0x10 != lVar23);
        }
      }
      else if (uVar21 != 0) {
        pdVar15 = pdVar15 + 8;
        lVar23 = local_198 * 4;
        lVar24 = 0;
        local_120 = lVar23;
        do {
          psVar3 = source_data->sel->sel_vector;
          if (psVar3 == (sel_t *)0x0) {
            uVar21 = local_198 + lVar24;
          }
          else {
            uVar21 = (ulong)*(uint *)((long)psVar3 + lVar24 * 4 + lVar23);
          }
          puVar4 = (source_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar4 == (unsigned_long *)0x0) ||
             ((puVar4[uVar21 >> 6] >> (uVar21 & 0x3f) & 1) != 0)) {
            uVar1 = pvVar9->count;
            lVar18 = *(long *)(source_data->data + uVar21 * 0x10 + 8);
            iVar22 = meta_data->child_list_size;
            meta_data->child_list_size = iVar22 + lVar18;
            lVar19 = (ulong)uVar1 * 0x10;
            *(idx_t *)(pdVar15 + lVar19 + -8) = iVar22;
            *(long *)(pdVar15 + lVar19) = lVar18;
          }
          else {
            uVar1 = pvVar9->count;
            if (local_110._M_head_impl == (unsigned_long *)0x0) {
              local_118 = local_108[0].type_info_.internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_158,(unsigned_long *)&local_118);
              peVar8 = local_108[0].type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_108[0].type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)
                   local_158.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              local_108[0]._0_8_ = local_158.sel_vector;
              local_158.sel_vector = (sel_t *)0x0;
              local_158.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              if (peVar8 != (element_type *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar8);
              }
              if ((element_type *)
                  local_158.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_158.selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
              }
              pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *
                                   )local_108);
              local_110._M_head_impl =
                   (pTVar16->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              lVar23 = local_120;
            }
            uVar21 = (ulong)uVar1 + lVar24;
            bVar7 = (byte)uVar21 & 0x3f;
            local_110._M_head_impl[uVar21 >> 6] =
                 local_110._M_head_impl[uVar21 >> 6] &
                 (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
          }
          lVar24 = lVar24 + 1;
          pdVar15 = pdVar15 + 0x10;
        } while (uVar17 + (uVar17 == 0) != lVar24);
      }
      pvVar9->count = pvVar9->count + (short)uVar17;
      copy_count = copy_count - uVar17;
      if (copy_count != 0) {
        if ((pvVar9->next_data).index == 0xffffffffffffffff) {
          ColumnDataCollectionSegment::AllocateVector
                    (pCVar2,&source->type,meta_data->chunk_data,&state->current_chunk_state,VVar10);
        }
        pvVar9 = vector<duckdb::VectorMetaData,_true>::operator[](&pCVar2->vector_data,VVar10.index)
        ;
        VVar10.index = (pvVar9->next_data).index;
      }
      if (local_108[0].type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_108[0].type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      local_198 = local_198 + uVar17;
    } while (copy_count != 0);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void ColumnDataCopy<list_entry_t>(ColumnDataMetaData &meta_data, const UnifiedVectorFormat &source_data, Vector &source,
                                  idx_t offset, idx_t copy_count) {

	auto &segment = meta_data.segment;

	auto &child_vector = ListVector::GetEntry(source);
	auto &child_type = child_vector.GetType();

	if (!meta_data.GetVectorMetaData().child_index.IsValid()) {
		auto child_index = segment.AllocateVector(child_type, meta_data.chunk_data, meta_data.state);
		meta_data.GetVectorMetaData().child_index = meta_data.segment.AddChildIndex(child_index);
	}

	auto &child_function = meta_data.copy_function.child_functions[0];
	auto child_index = segment.GetChildIndex(meta_data.GetVectorMetaData().child_index);

	// figure out the current list size by traversing the set of child entries
	idx_t current_list_size = 0;
	auto current_child_index = child_index;
	while (current_child_index.IsValid()) {
		auto &child_vdata = segment.GetVectorData(current_child_index);
		current_list_size += child_vdata.count;
		current_child_index = child_vdata.next_data;
	}

	// set the child vector
	UnifiedVectorFormat child_vector_data;
	ColumnDataMetaData child_meta_data(child_function, meta_data, child_index);
	auto info = ListVector::GetConsecutiveChildListInfo(source, offset, copy_count);

	if (info.needs_slicing) {
		SelectionVector sel(info.child_list_info.length);
		ListVector::GetConsecutiveChildSelVector(source, sel, offset, copy_count);

		auto sliced_child_vector = Vector(child_vector, sel, info.child_list_info.length);
		sliced_child_vector.Flatten(info.child_list_info.length);
		info.child_list_info.offset = 0;

		sliced_child_vector.ToUnifiedFormat(info.child_list_info.length, child_vector_data);
		child_function.function(child_meta_data, child_vector_data, sliced_child_vector, info.child_list_info.offset,
		                        info.child_list_info.length);

	} else {
		child_vector.ToUnifiedFormat(info.child_list_info.length, child_vector_data);
		child_function.function(child_meta_data, child_vector_data, child_vector, info.child_list_info.offset,
		                        info.child_list_info.length);
	}

	// now copy the list entries
	meta_data.child_list_size = current_list_size;
	if (info.is_constant) {
		TemplatedColumnDataCopy<ConstListValueCopy>(meta_data, source_data, source, offset, copy_count);
	} else {
		TemplatedColumnDataCopy<ListValueCopy>(meta_data, source_data, source, offset, copy_count);
	}
}